

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O2

intptr_t DlgProc(uintptr_t pDlg,char *DlgItemName,intptr_t Msg,intptr_t wParam,intptr_t lParam)

{
  bool bVar1;
  int iVar2;
  Json *pJVar3;
  string *psVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  *__x;
  intptr_t iVar5;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  char *value;
  intptr_t iStack_290;
  allocator local_281;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> local_280;
  key_type local_270;
  object json_obj;
  ofstream ofs;
  
  if (Msg == 0x1001) {
    iVar2 = strcmp(DlgItemName,"btnOK");
    if (iVar2 == 0) {
      __x = &json11::Json::object_items_abi_cxx11_(&gJson)->_M_t;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::_Rb_tree(&json_obj._M_t,__x);
      std::ofstream::ofstream(&ofs);
      iVar5 = (*gExtension->SendDlgMsg)(pDlg,"getTokenRadio",0x13,0,0);
      value = "manual";
      if ((int)iVar5 == 0) {
        value = "oauth";
      }
      json11::Json::Json((Json *)&local_280,value);
      std::__cxx11::string::string((string *)&local_270,"get_token_method",&local_281);
      p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
               ::operator[](&json_obj,&local_270);
      std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var6,&local_280)
      ;
      std::__cxx11::string::~string((string *)&local_270);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
      iVar5 = (*gExtension->SendDlgMsg)(pDlg,"saveMethodRadio",0x13,0,0);
      if ((int)iVar5 == 1) {
        json11::Json::Json((Json *)&local_280,"config");
        std::__cxx11::string::string((string *)&local_270,"save_type",&local_281);
        p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[](&json_obj,&local_270);
      }
      else if ((int)iVar5 == 2) {
        json11::Json::Json((Json *)&local_280,"password_manager");
        std::__cxx11::string::string((string *)&local_270,"save_type",&local_281);
        p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[](&json_obj,&local_270);
        std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var6,&local_280);
        std::__cxx11::string::~string((string *)&local_270);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
        json11::Json::Json((Json *)&local_280,"");
        std::__cxx11::string::string((string *)&local_270,"oauth_token",&local_281);
        p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[](&json_obj,&local_270);
      }
      else {
        json11::Json::Json((Json *)&local_280,"dont_save");
        std::__cxx11::string::string((string *)&local_270,"save_type",&local_281);
        p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[](&json_obj,&local_270);
        std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var6,&local_280);
        std::__cxx11::string::~string((string *)&local_270);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
        json11::Json::Json((Json *)&local_280,"");
        std::__cxx11::string::string((string *)&local_270,"oauth_token",&local_281);
        p_Var6 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[](&json_obj,&local_270);
      }
      std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var6,&local_280)
      ;
      std::__cxx11::string::~string((string *)&local_270);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
      std::ofstream::open((string *)&ofs,0x19a1f0);
      json11::Json::Json((Json *)&local_280,&json_obj);
      json11::Json::dump_abi_cxx11_(&local_270,(Json *)&local_280);
      std::operator<<((ostream *)&ofs,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
      std::ofstream::close();
      (*gExtension->SendDlgMsg)(pDlg,DlgItemName,1,1,0);
      std::ofstream::~ofstream(&ofs);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::~_Rb_tree(&json_obj._M_t);
      return 0;
    }
    iVar2 = strcmp(DlgItemName,"btnCancel");
    if (iVar2 != 0) {
      return 0;
    }
    iStack_290 = 1;
    iVar5 = iStack_290;
    goto LAB_0016c331;
  }
  if (Msg != 0x1005) {
    return 0;
  }
  std::__cxx11::string::string((string *)&ofs,"get_token_method",(allocator *)&local_270);
  pJVar3 = json11::Json::operator[](&gJson,(string *)&ofs);
  bVar1 = json11::Json::is_string(pJVar3);
  if (bVar1) {
    std::__cxx11::string::string((string *)&json_obj,"get_token_method",(allocator *)&local_280);
    pJVar3 = json11::Json::operator[](&gJson,(string *)&json_obj);
    psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
    bVar1 = std::operator==(psVar4,"manual");
    std::__cxx11::string::~string((string *)&json_obj);
    std::__cxx11::string::~string((string *)&ofs);
    if (!bVar1) goto LAB_0016c035;
    iVar5 = 1;
  }
  else {
    std::__cxx11::string::~string((string *)&ofs);
LAB_0016c035:
    iVar5 = 0;
  }
  (*gExtension->SendDlgMsg)(pDlg,"getTokenRadio",0x14,iVar5,0);
  std::__cxx11::string::string((string *)&ofs,"save_type",(allocator *)&local_270);
  pJVar3 = json11::Json::operator[](&gJson,(string *)&ofs);
  bVar1 = json11::Json::is_string(pJVar3);
  if (bVar1) {
    std::__cxx11::string::string((string *)&json_obj,"save_type",(allocator *)&local_280);
    pJVar3 = json11::Json::operator[](&gJson,(string *)&json_obj);
    psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
    bVar1 = std::operator==(psVar4,"config");
    std::__cxx11::string::~string((string *)&json_obj);
    std::__cxx11::string::~string((string *)&ofs);
    if (!bVar1) goto LAB_0016c101;
    iStack_290 = 1;
LAB_0016c1a4:
    DlgItemName = "saveMethodRadio";
    iVar5 = 0x14;
  }
  else {
    std::__cxx11::string::~string((string *)&ofs);
LAB_0016c101:
    std::__cxx11::string::string((string *)&ofs,"save_type",(allocator *)&local_270);
    pJVar3 = json11::Json::operator[](&gJson,(string *)&ofs);
    bVar1 = json11::Json::is_string(pJVar3);
    if (bVar1) {
      std::__cxx11::string::string((string *)&json_obj,"save_type",(allocator *)&local_280);
      pJVar3 = json11::Json::operator[](&gJson,(string *)&json_obj);
      psVar4 = json11::Json::string_value_abi_cxx11_(pJVar3);
      bVar1 = std::operator==(psVar4,"password_manager");
      std::__cxx11::string::~string((string *)&json_obj);
      std::__cxx11::string::~string((string *)&ofs);
      if (bVar1) {
        iStack_290 = 2;
        goto LAB_0016c1a4;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ofs);
    }
    DlgItemName = "saveMethodRadio";
    iStack_290 = 0;
    iVar5 = 0x14;
  }
LAB_0016c331:
  (*gExtension->SendDlgMsg)(pDlg,DlgItemName,iVar5,iStack_290,0);
  return 0;
}

Assistant:

intptr_t DCPCALL DlgProc(uintptr_t pDlg, char *DlgItemName, intptr_t Msg, intptr_t wParam, intptr_t lParam)
{
    switch (Msg){
        case DN_INITDIALOG:
            if(gJson["get_token_method"].is_string() && gJson["get_token_method"].string_value() == "manual")
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 1, 0);
            else
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 0, 0);

            if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "config")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 1, 0);
            else if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "password_manager")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 2, 0);
            else
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 0, 0); // dont_save by default

            break;

        case DN_CHANGE:
            break;

        case DN_CLICK:
            if(strcmp(DlgItemName, "btnOK")==0){
                json11::Json::object json_obj = gJson.object_items();
                std::ofstream ofs;

                int res = gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTGETITEMINDEX, 0, 0);
                json_obj["get_token_method"] = (res==0)? "oauth" : "manual";

                res = gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTGETITEMINDEX, 0, 0);
                switch(res){
                    case 1:
                        json_obj["save_type"] = "config";
                        break;
                    case 2:
                        json_obj["save_type"] = "password_manager";
                        json_obj["oauth_token"] = "";
                        break;
                    default:
                        json_obj["save_type"] = "dont_save";
                        json_obj["oauth_token"] = "";
                }

                ofs.open(gConfig_path, std::ofstream::out | std::ios::trunc);
                ofs << json11::Json(json_obj).dump();
                ofs.close();

                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            } else if(strcmp(DlgItemName, "btnCancel")==0){
                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            }

            break;
    }
    return 0;
}